

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFanout.c
# Opt level: O0

void Aig_ObjRemoveFanout(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pFanout)

{
  int iVar1;
  int Num;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *pNext;
  int *pPrev;
  int *pNextC;
  int *pPrevC;
  int *pFirst;
  int iFan;
  Aig_Obj_t *pFanout_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  if (((p->pFanData == (int *)0x0) || (p->nFansAlloc <= pObj->Id)) || (p->nFansAlloc <= pFanout->Id)
     ) {
    __assert_fail("p->pFanData && pObj->Id < p->nFansAlloc && pFanout->Id < p->nFansAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0x9d,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_IsComplement(pObj);
  if ((iVar1 != 0) || (iVar1 = Aig_IsComplement(pFanout), iVar1 != 0)) {
    __assert_fail("!Aig_IsComplement(pObj) && !Aig_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0x9e,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (pFanout->Id < 1) {
    __assert_fail("pFanout->Id > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0x9f,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar1 = pFanout->Id;
  Num = Aig_ObjWhatFanin(pFanout,pObj);
  iVar1 = Aig_FanoutCreate(iVar1,Num);
  piVar2 = Aig_FanoutPrev(p->pFanData,iVar1);
  piVar3 = Aig_FanoutNext(p->pFanData,iVar1);
  piVar4 = Aig_FanoutPrev(p->pFanData,*piVar3);
  piVar5 = Aig_FanoutNext(p->pFanData,*piVar2);
  if (*piVar4 == iVar1) {
    if (*piVar5 != iVar1) {
      __assert_fail("*pNext == iFan",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                    ,0xa6,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    piVar6 = Aig_FanoutObj(p->pFanData,pObj->Id);
    if (0 < *piVar6) {
      if (*piVar6 == iVar1) {
        if (*piVar3 == iVar1) {
          *piVar6 = 0;
          *piVar4 = 0;
          *piVar5 = 0;
          *piVar2 = 0;
          *piVar3 = 0;
          return;
        }
        *piVar6 = *piVar3;
      }
      *piVar4 = *piVar2;
      *piVar5 = *piVar3;
      *piVar2 = 0;
      *piVar3 = 0;
      return;
    }
    __assert_fail("*pFirst > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                  ,0xa8,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  __assert_fail("*pPrev == iFan",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigFanout.c"
                ,0xa5,"void Aig_ObjRemoveFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_ObjRemoveFanout( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pFanout )
{
    int iFan, * pFirst, * pPrevC, * pNextC, * pPrev, * pNext;
    assert( p->pFanData && pObj->Id < p->nFansAlloc && pFanout->Id < p->nFansAlloc );
    assert( !Aig_IsComplement(pObj) && !Aig_IsComplement(pFanout) );
    assert( pFanout->Id > 0 );
    iFan   = Aig_FanoutCreate( pFanout->Id, Aig_ObjWhatFanin(pFanout, pObj) );
    pPrevC = Aig_FanoutPrev( p->pFanData, iFan );
    pNextC = Aig_FanoutNext( p->pFanData, iFan );
    pPrev  = Aig_FanoutPrev( p->pFanData, *pNextC );
    pNext  = Aig_FanoutNext( p->pFanData, *pPrevC );
    assert( *pPrev == iFan );
    assert( *pNext == iFan );
    pFirst = Aig_FanoutObj( p->pFanData, pObj->Id );
    assert( *pFirst > 0 );
    if ( *pFirst == iFan )
    {
        if ( *pNextC == iFan )
        {
            *pFirst = 0;
            *pPrev  = 0;
            *pNext  = 0;
            *pPrevC = 0;
            *pNextC = 0;
            return;
        }
        *pFirst = *pNextC;
    }
    *pPrev  = *pPrevC;
    *pNext  = *pNextC;
    *pPrevC = 0;
    *pNextC = 0;
}